

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O3

bool ithi_endswith(char *target,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t ix;
  bool bVar4;
  
  sVar2 = strlen(target);
  sVar3 = strlen(suffix);
  if (sVar2 < sVar3) {
    bVar4 = false;
  }
  else {
    iVar1 = strcmp(target + (sVar2 - sVar3),suffix);
    bVar4 = iVar1 == 0;
  }
  return bVar4;
}

Assistant:

bool ithi_endswith(char const* target, char const* suffix)
{
    size_t target_length = strlen(target);
    size_t suffix_length = strlen(suffix);
    bool ret = suffix_length <= target_length;
    if (ret) {
        size_t ix = target_length - suffix_length;
        ret &= (strcmp(target + ix, suffix) == 0);
    }
    return ret;
}